

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O3

Bool prvTidySwitchInline(TidyDocImpl *doc,Node *element,Node *node)

{
  uint uVar1;
  Lexer *pLVar2;
  Dict *pDVar3;
  Dict *pDVar4;
  IStack *pIVar5;
  tmbstr ptVar6;
  AttVal *pAVar7;
  IStack *pIVar8;
  AttVal *pAVar9;
  uint uVar10;
  IStack *pIVar11;
  uint uVar12;
  ulong uVar13;
  Lexer *lexer;
  IStack *pIVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  IStack tmp_istack;
  
  pLVar2 = doc->lexer;
  if (((element != (Node *)0x0 && pLVar2 != (Lexer *)0x0) &&
      (pDVar3 = element->tag, node != (Node *)0x0 && pDVar3 != (Dict *)0x0)) &&
     (pDVar4 = node->tag, pDVar4 != (Dict *)0x0)) {
    uVar1 = pLVar2->istacksize;
    uVar15 = uVar1;
    do {
      uVar15 = uVar15 - 1;
      if ((int)uVar15 < 0) {
        return no;
      }
      pIVar11 = pLVar2->istack;
      uVar16 = uVar1;
    } while (pIVar11[uVar15 & 0x7fffffff].tag != pDVar3);
    do {
      uVar16 = uVar16 - 1;
      if ((int)uVar16 < 0) {
        return no;
      }
    } while (pIVar11[uVar16 & 0x7fffffff].tag != pDVar4);
    uVar12 = uVar1 - pLVar2->istackbase;
    if (0x80000000 < uVar12 + 0x7fffffff) {
      uVar17 = uVar12 - 1;
      do {
        uVar10 = uVar17;
        if ((pIVar11[uVar17].tag == pDVar3) && (uVar10 = uVar12 - 2, -1 < (int)(uVar12 - 2))) {
          pIVar14 = pIVar11 + uVar17;
          uVar13 = (ulong)(uVar12 - 1);
          do {
            uVar12 = (int)uVar13 - 1;
            uVar13 = (ulong)uVar12;
            if (pIVar11[uVar13].tag == pDVar4) {
              pIVar11 = pIVar11 + uVar13;
              pIVar5 = pIVar11->next;
              pDVar3 = pIVar11->tag;
              ptVar6 = pIVar11->element;
              pAVar7 = pIVar11->attributes;
              pIVar8 = pIVar14->next;
              pDVar4 = pIVar14->tag;
              pAVar9 = pIVar14->attributes;
              pIVar11->element = pIVar14->element;
              pIVar11->attributes = pAVar9;
              pIVar11->next = pIVar8;
              pIVar11->tag = pDVar4;
              pIVar14->element = ptVar6;
              pIVar14->attributes = pAVar7;
              pIVar14->next = pIVar5;
              pIVar14->tag = pDVar3;
              return yes;
            }
          } while (0 < (int)uVar12);
          return no;
        }
        uVar12 = uVar10;
        uVar17 = uVar12 - 1;
      } while (-1 < (int)uVar17);
    }
  }
  return no;
}

Assistant:

Bool TY_(SwitchInline)( TidyDocImpl* doc, Node* element, Node* node )
{
    Lexer* lexer = doc->lexer;
    if ( lexer
         && element && element->tag
         && node && node->tag
         && TY_(IsPushed)( doc, element )
         && TY_(IsPushed)( doc, node ) 
         && ((lexer->istacksize - lexer->istackbase) >= 2) )
    {
        /* we have a chance of succeeding ... */
        int i;
        for (i = (lexer->istacksize - lexer->istackbase - 1); i >= 0; --i)
        {
            if (lexer->istack[i].tag == element->tag) {
                /* found the element tag - phew */
                IStack *istack1 = &lexer->istack[i];
                IStack *istack2 = NULL;
                --i; /* back one more, and continue */
                for ( ; i >= 0; --i)
                {
                    if (lexer->istack[i].tag == node->tag)
                    {
                        /* found the element tag - phew */
                        istack2 = &lexer->istack[i];
                        break;
                    }
                }
                if ( istack2 )
                {
                    /* perform the swap */
                    IStack tmp_istack = *istack2;
                    *istack2 = *istack1;
                    *istack1 = tmp_istack;
                    return yes;
                }
            }
        }
    }
    return no;
}